

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

void CreateDefaultClassAssignment
               (ExpressionContext *ctx,SynBase *source,ExprClassDefinition *classDefinition)

{
  FunctionData *type;
  TypeBase *pTVar1;
  Allocator *pAVar2;
  ScopeData *scope;
  ArgumentData *pAVar3;
  TypeBase *pTVar4;
  ExprBase **ppEVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  VariableData *pVVar8;
  undefined8 uVar9;
  FunctionData *pFVar10;
  ArrayView<ArgumentData> arguments_00;
  ArrayView<ArgumentData> arguments_01;
  int iVar11;
  TypeRef *pTVar12;
  ExprBase *pEVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  FunctionData *pFVar15;
  undefined4 extraout_var_02;
  SynIdentifier *pSVar16;
  undefined4 extraout_var_04;
  TypeFunction *pTVar17;
  SynBase *pSVar18;
  ExprVariableDefinition *pEVar19;
  ExprBase *pEVar20;
  undefined4 extraout_var_05;
  _func_int **pp_Var21;
  undefined4 extraout_var_07;
  long lVar22;
  SmallArray<FunctionValue,_32U> *functions_00;
  char *pcVar23;
  uint uVar24;
  undefined8 *puVar25;
  ulong uVar26;
  MatchData *pMVar27;
  bool bVar28;
  ArrayView<FunctionValue> functions_01;
  ArrayView<FunctionValue> functions_02;
  ArrayView<ArgumentData> arguments_02;
  InplaceStr name;
  ArrayView<ArgumentData> arguments_03;
  InplaceStr name_00;
  InplaceStr name_01;
  FunctionValue bestOverload;
  IntrusiveList<ExprBase> expressions;
  IntrusiveList<VariableHandle> customAssignMembers;
  SmallArray<ArgumentData,_2U> arguments;
  SmallArray<unsigned_int,_32U> ratings;
  SmallArray<FunctionValue,_32U> functions;
  FunctionValue local_4f8;
  IntrusiveList<ExprBase> local_4d8;
  IntrusiveList<VariableHandle> local_4c8;
  undefined1 local_4b8 [8];
  undefined8 uStack_4b0;
  SynBase local_4a8;
  Allocator *local_448;
  SynBase *local_438;
  uint uStack_430;
  undefined4 uStack_42c;
  SynBase *local_428;
  uint uStack_420;
  undefined4 uStack_41c;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined1 local_3e8 [8];
  ExprBase *pEStack_3e0;
  ExprBase local_3d8 [2];
  Allocator *local_358;
  undefined1 auStack_350 [8];
  SmallArray<FunctionValue,_32U> local_348;
  VariableHandle *pVVar14;
  undefined4 extraout_var_03;
  undefined4 extraout_var_06;
  
  ExpressionContext::PopScope(ctx,SCOPE_TYPE,true);
  type = (FunctionData *)classDefinition->classType;
  local_4c8.head = (VariableHandle *)0x0;
  local_4c8.tail = (VariableHandle *)0x0;
  for (pMVar27 = (type->aliases).tail; pMVar27 != (MatchData *)0x0;
      pMVar27 = *(MatchData **)&pMVar27->listed) {
    pTVar1 = (TypeBase *)pMVar27->type->importModule;
    if ((pTVar1 == (TypeBase *)0x0) ||
       ((pTVar1->typeID != 0x12 &&
        ((pTVar1 == (TypeBase *)0x0 ||
         ((pTVar1->typeID != 0x13 &&
          ((pTVar1 == (TypeBase *)0x0 ||
           ((pTVar1->typeID != 0x14 &&
            ((pTVar1 == (TypeBase *)0x0 ||
             ((pTVar1->typeID != 0x15 && ((pTVar1 == (TypeBase *)0x0 || (pTVar1->typeID != 0))))))))
           )))))))))) {
      pAVar2 = ctx->allocator;
      lVar22 = 0x20;
      do {
        *(undefined8 *)((long)&local_4c8.head + lVar22) = 0;
        local_4b8[lVar22 + -8] = 0;
        *(undefined8 *)(local_4b8 + lVar22) = 0;
        *(undefined8 *)((long)&uStack_4b0 + lVar22) = 0;
        *(undefined8 *)((long)&local_4a8._vptr_SynBase + lVar22) = 0;
        *(undefined8 *)((long)&local_4a8.typeID + lVar22) = 0;
        lVar22 = lVar22 + 0x30;
      } while (lVar22 != 0x80);
      local_4b8 = (undefined1  [8])&local_4a8;
      uStack_4b0 = (FunctionData *)0x200000000;
      local_448 = pAVar2;
      pTVar12 = ExpressionContext::GetReferenceType(ctx,pTVar1);
      if ((uint)uStack_4b0 == uStack_4b0._4_4_) {
        SmallArray<ArgumentData,_2U>::grow
                  ((SmallArray<ArgumentData,_2U> *)local_4b8,(uint)uStack_4b0);
      }
      if (local_4b8 == (undefined1  [8])0x0) goto LAB_00202456;
      uVar26 = (ulong)uStack_4b0 & 0xffffffff;
      uVar24 = (uint)uStack_4b0 + 1;
      uStack_4b0 = (FunctionData *)CONCAT44(uStack_4b0._4_4_,uVar24);
      ((SynBase **)local_4b8)[uVar26 * 6] = source;
      ((bool *)((long)local_4b8 + 8))[uVar26 * 0x30] = false;
      ((SynIdentifier **)((long)local_4b8 + 0x10))[uVar26 * 6] = (SynIdentifier *)0x0;
      ((TypeBase **)((long)local_4b8 + 0x18))[uVar26 * 6] = &pTVar12->super_TypeBase;
      ((InplaceStr *)((long)local_4b8 + 0x20))[uVar26 * 3].begin = (char *)0x0;
      ((InplaceStr *)((long)local_4b8 + 0x20))[uVar26 * 3].end = (char *)0x0;
      if (uVar24 == uStack_4b0._4_4_) {
        SmallArray<ArgumentData,_2U>::grow((SmallArray<ArgumentData,_2U> *)local_4b8,uVar24);
      }
      if (local_4b8 == (undefined1  [8])0x0) goto LAB_00202456;
      uVar26 = (ulong)uStack_4b0 & 0xffffffff;
      uStack_4b0 = (FunctionData *)CONCAT44(uStack_4b0._4_4_,(uint)uStack_4b0 + 1);
      functions_00 = (SmallArray<FunctionValue,_32U> *)(uVar26 * 0x30);
      *(SynBase **)
       ((long)&functions_00->little[0].source + (long)&((SynBase *)((long)local_4b8 + -0x40))->next)
           = source;
      ((bool *)((long)local_4b8 + 8))[(long)functions_00] = false;
      ((SynIdentifier **)((long)local_4b8 + 0x10))[uVar26 * 6] = (SynIdentifier *)0x0;
      ((TypeBase **)((long)local_4b8 + 0x18))[uVar26 * 6] = pTVar1;
      ((InplaceStr *)((long)local_4b8 + 0x20))[uVar26 * 3].begin = (char *)0x0;
      ((InplaceStr *)((long)local_4b8 + 0x20))[uVar26 * 3].end = (char *)0x0;
      name_00.end = "";
      name_00.begin = "=";
      auVar7._8_8_ = 0;
      auVar7._0_8_ = functions_00;
      pEVar13 = CreateVariableAccess
                          (ctx,source,(IntrusiveList<SynIdentifier>)(auVar7 << 0x40),name_00,false);
      if (pEVar13 == (ExprBase *)0x0) {
LAB_00201c27:
        name_01.end = "";
        name_01.begin = "default_assign$_";
        auVar6._8_8_ = 0;
        auVar6._0_8_ = functions_00;
        pEVar13 = CreateVariableAccess
                            (ctx,source,(IntrusiveList<SynIdentifier>)(auVar6 << 0x40),name_01,false
                            );
        if (pEVar13 != (ExprBase *)0x0) {
          pAVar2 = ctx->allocator;
          memset(local_348.little,0,0x300);
          local_348.count = 0;
          local_348.max = 0x20;
          local_348.data = local_348.little;
          local_348.allocator = pAVar2;
          GetNodeFunctions(ctx,source,pEVar13,&local_348);
          if (local_348.count != 0) {
            local_358 = ctx->allocator;
            local_3e8 = (undefined1  [8])local_3d8;
            pEStack_3e0 = (ExprBase *)0x2000000000;
            local_408 = 0;
            uStack_400 = 0;
            local_438 = (SynBase *)local_4b8;
            uStack_430 = (uint)uStack_4b0;
            arguments_01._12_4_ = uStack_42c;
            arguments_01.count = (uint)uStack_4b0;
            arguments_01.data = (ArgumentData *)local_4b8;
            functions_02.count = local_348.count;
            functions_02.data = local_348.data;
            functions_02._12_4_ = 0;
            SelectBestFunction(&local_4f8,ctx,source,functions_02,
                               (IntrusiveList<TypeHandle>)ZEXT816(0),arguments_01,
                               (SmallArray<unsigned_int,_32U> *)local_3e8);
            if (local_4f8.function != (FunctionData *)0x0) {
              iVar11 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
              pVVar14 = (VariableHandle *)CONCAT44(extraout_var_00,iVar11);
              pVVar8 = (VariableData *)pMVar27->type;
              pVVar14->source = &pMVar27->name->super_SynBase;
              pVVar14->variable = pVVar8;
              pVVar14->next = (VariableHandle *)0x0;
              pVVar14->listed = false;
              IntrusiveList<VariableHandle>::push_back(&local_4c8,pVVar14);
            }
            SmallArray<unsigned_int,_32U>::~SmallArray((SmallArray<unsigned_int,_32U> *)local_3e8);
          }
          SmallArray<FunctionValue,_32U>::~SmallArray(&local_348);
        }
      }
      else {
        pAVar2 = ctx->allocator;
        memset(local_348.little,0,0x300);
        local_348.count = 0;
        local_348.max = 0x20;
        functions_00 = &local_348;
        local_348.data = local_348.little;
        local_348.allocator = pAVar2;
        GetNodeFunctions(ctx,source,pEVar13,functions_00);
        if (local_348.count == 0) {
LAB_00201c0b:
          bVar28 = false;
        }
        else {
          local_358 = ctx->allocator;
          local_3e8 = (undefined1  [8])local_3d8;
          pEStack_3e0 = (ExprBase *)0x2000000000;
          local_3f8 = 0;
          uStack_3f0 = 0;
          local_428 = (SynBase *)local_4b8;
          uStack_420 = (uint)uStack_4b0;
          arguments_00._12_4_ = uStack_41c;
          arguments_00.count = (uint)uStack_4b0;
          arguments_00.data = (ArgumentData *)local_4b8;
          functions_01.count = local_348.count;
          functions_01.data = local_348.data;
          functions_01._12_4_ = 0;
          functions_00 = (SmallArray<FunctionValue,_32U> *)local_348.data;
          SelectBestFunction(&local_4f8,ctx,source,functions_01,
                             (IntrusiveList<TypeHandle>)ZEXT816(0),arguments_00,
                             (SmallArray<unsigned_int,_32U> *)local_3e8);
          pFVar15 = local_4f8.function;
          bVar28 = local_4f8.function != (FunctionData *)0x0;
          if (bVar28) {
            iVar11 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
            pVVar14 = (VariableHandle *)CONCAT44(extraout_var,iVar11);
            pVVar8 = (VariableData *)pMVar27->type;
            pVVar14->source = &pMVar27->name->super_SynBase;
            pVVar14->variable = pVVar8;
            pVVar14->next = (VariableHandle *)0x0;
            pVVar14->listed = false;
            IntrusiveList<VariableHandle>::push_back(&local_4c8,pVVar14);
          }
          SmallArray<unsigned_int,_32U>::~SmallArray((SmallArray<unsigned_int,_32U> *)local_3e8);
          if (pFVar15 == (FunctionData *)0x0) goto LAB_00201c0b;
        }
        SmallArray<FunctionValue,_32U>::~SmallArray(&local_348);
        if (!bVar28) goto LAB_00201c27;
      }
      SmallArray<ArgumentData,_2U>::~SmallArray((SmallArray<ArgumentData,_2U> *)local_4b8);
    }
  }
  if (local_4c8.head == (VariableHandle *)0x0) {
LAB_00202430:
    RestoreParentTypeScope(ctx,source,(TypeBase *)classDefinition->classType);
    return;
  }
  pSVar18 = (SynBase *)ctx->allocator;
  lVar22 = 0x20;
  do {
    *(undefined8 *)(auStack_350 + lVar22 + -8) = 0;
    auStack_350[lVar22] = 0;
    *(undefined8 *)((long)local_348.little + lVar22 + -0x10) = 0;
    *(undefined8 *)((long)local_348.little + lVar22 + -8) = 0;
    *(undefined8 *)((long)&local_348.little[0].source + lVar22) = 0;
    *(undefined8 *)((long)&local_348.little[0].function + lVar22) = 0;
    lVar22 = lVar22 + 0x30;
  } while (lVar22 != 0x80);
  local_348.data = local_348.little;
  local_348.count = 0;
  local_348.max = 2;
  local_348.little[4].source = pSVar18;
  iVar11 = (*pSVar18->_vptr_SynBase[2])(pSVar18,0x50);
  pSVar18 = (SynBase *)CONCAT44(extraout_var_01,iVar11);
  pSVar18->typeID = 4;
  pSVar18->begin = (Lexeme *)0x0;
  pSVar18->end = (Lexeme *)0x0;
  (pSVar18->pos).begin = (char *)0x0;
  (pSVar18->pos).end = (char *)0x0;
  *(undefined8 *)((long)&(pSVar18->pos).end + 2) = 0;
  *(undefined8 *)((long)&pSVar18->next + 2) = 0;
  pSVar18->_vptr_SynBase = (_func_int **)&PTR__SynBase_003f6178;
  pSVar18[1]._vptr_SynBase = (_func_int **)"$left";
  *(char **)&pSVar18[1].typeID = "";
  pFVar15 = (FunctionData *)ExpressionContext::GetReferenceType(ctx,(TypeBase *)type);
  if (local_348.count == local_348.max) {
    SmallArray<ArgumentData,_2U>::grow((SmallArray<ArgumentData,_2U> *)&local_348,local_348.count);
  }
  if ((SmallArray<FunctionValue,_32U> *)local_348.data != (SmallArray<FunctionValue,_32U> *)0x0) {
    uVar26 = (ulong)local_348.count;
    local_348.count = local_348.count + 1;
    ((FunctionValue *)&(local_348.data)->context)[uVar26 * 2 + -1].function = (FunctionData *)source
    ;
    *(undefined1 *)&((FunctionValue *)&(local_348.data)->context)[uVar26 * 2 + -1].context = 0;
    ((FunctionValue *)&(local_348.data)->context)[uVar26 * 2].source = pSVar18;
    ((FunctionValue *)&(local_348.data)->context)[uVar26 * 2].function = pFVar15;
    ppEVar5 = &((FunctionValue *)&(local_348.data)->context)[uVar26 * 2].context;
    *ppEVar5 = (ExprBase *)0x0;
    ppEVar5[1] = (ExprBase *)0x0;
    iVar11 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
    pSVar18 = (SynBase *)CONCAT44(extraout_var_02,iVar11);
    pSVar18->typeID = 4;
    pSVar18->begin = (Lexeme *)0x0;
    pSVar18->end = (Lexeme *)0x0;
    (pSVar18->pos).begin = (char *)0x0;
    (pSVar18->pos).end = (char *)0x0;
    *(undefined8 *)((long)&(pSVar18->pos).end + 2) = 0;
    *(undefined8 *)((long)&pSVar18->next + 2) = 0;
    pSVar18->_vptr_SynBase = (_func_int **)&PTR__SynBase_003f6178;
    pSVar18[1]._vptr_SynBase = (_func_int **)"$right";
    *(char **)&pSVar18[1].typeID = "";
    if (local_348.count == local_348.max) {
      SmallArray<ArgumentData,_2U>::grow((SmallArray<ArgumentData,_2U> *)&local_348,local_348.count)
      ;
    }
    if ((SmallArray<FunctionValue,_32U> *)local_348.data != (SmallArray<FunctionValue,_32U> *)0x0) {
      uVar26 = (ulong)local_348.count;
      local_348.count = local_348.count + 1;
      ((FunctionValue *)&(local_348.data)->context)[uVar26 * 2 + -1].function =
           (FunctionData *)source;
      *(undefined1 *)&((FunctionValue *)&(local_348.data)->context)[uVar26 * 2 + -1].context = 0;
      ((FunctionValue *)&(local_348.data)->context)[uVar26 * 2].source = pSVar18;
      ((FunctionValue *)&(local_348.data)->context)[uVar26 * 2].function = type;
      ppEVar5 = &((FunctionValue *)&(local_348.data)->context)[uVar26 * 2].context;
      *ppEVar5 = (ExprBase *)0x0;
      ppEVar5[1] = (ExprBase *)0x0;
      iVar11 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      pSVar16 = (SynIdentifier *)CONCAT44(extraout_var_03,iVar11);
      (pSVar16->super_SynBase).typeID = 4;
      (pSVar16->super_SynBase).begin = (Lexeme *)0x0;
      (pSVar16->super_SynBase).end = (Lexeme *)0x0;
      (pSVar16->super_SynBase).pos.begin = (char *)0x0;
      (pSVar16->super_SynBase).pos.end = (char *)0x0;
      *(undefined8 *)((long)&(pSVar16->super_SynBase).pos.end + 2) = 0;
      *(undefined8 *)((long)&(pSVar16->super_SynBase).next + 2) = 0;
      (pSVar16->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003f6178;
      (pSVar16->name).begin = "default_assign$_";
      (pSVar16->name).end = "";
      iVar11 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x338);
      pFVar15 = (FunctionData *)CONCAT44(extraout_var_04,iVar11);
      pAVar2 = ctx->allocator;
      scope = ctx->scope;
      arguments_02.count = local_348.count;
      arguments_02.data = (ArgumentData *)local_348.data;
      arguments_02._12_4_ = 0;
      pTVar17 = ExpressionContext::GetFunctionType(ctx,source,ctx->typeVoid,arguments_02);
      pTVar12 = ExpressionContext::GetReferenceType(ctx,ctx->typeVoid);
      local_418 = 0;
      uStack_410 = 0;
      uVar24 = ctx->uniqueFunctionId;
      ctx->uniqueFunctionId = uVar24 + 1;
      pcVar23 = (char *)0x0;
      FunctionData::FunctionData
                (pFVar15,pAVar2,source,scope,false,false,false,pTVar17,&pTVar12->super_TypeBase,
                 pSVar16,(IntrusiveList<MatchData>)ZEXT816(0),uVar24);
      (type->arguments).little[3].type = (TypeBase *)pFVar15;
      if (local_348.count != 0) {
        lVar22 = 0;
        uVar26 = 0;
        do {
          puVar25 = (undefined8 *)((long)&(local_348.data)->context + lVar22 + -0x10);
          uVar24 = (pFVar15->arguments).count;
          if (uVar24 == (pFVar15->arguments).max) {
            SmallArray<ArgumentData,_4U>::grow(&pFVar15->arguments,uVar24);
          }
          pAVar3 = (pFVar15->arguments).data;
          if (pAVar3 == (ArgumentData *)0x0) {
            pcVar23 = 
            "void SmallArray<ArgumentData, 4>::push_back(const T &) [T = ArgumentData, N = 4]";
            goto LAB_00202482;
          }
          uVar24 = (pFVar15->arguments).count;
          (pFVar15->arguments).count = uVar24 + 1;
          pSVar18 = (SynBase *)*puVar25;
          uVar9 = puVar25[1];
          pSVar16 = (SynIdentifier *)puVar25[2];
          pTVar1 = (TypeBase *)puVar25[3];
          pFVar10 = (FunctionData *)puVar25[5];
          pAVar3[uVar24].value = (ExprBase *)puVar25[4];
          (&pAVar3[uVar24].value)[1] = (ExprBase *)pFVar10;
          pAVar3[uVar24].name = pSVar16;
          (&pAVar3[uVar24].name)[1] = (SynIdentifier *)pTVar1;
          pAVar3[uVar24].source = pSVar18;
          *(undefined8 *)&pAVar3[uVar24].isExplicit = uVar9;
          uVar26 = uVar26 + 1;
          lVar22 = lVar22 + 0x30;
        } while (uVar26 < local_348.count);
      }
      name.end = pcVar23;
      name.begin = (pFVar15->name->name).end;
      anon_unknown.dwarf_11255e::CheckFunctionConflict
                ((anon_unknown_dwarf_11255e *)ctx,(ExpressionContext *)source,
                 (SynBase *)(pFVar15->name->name).begin,name);
      ExpressionContext::AddFunction(ctx,pFVar15);
      ExpressionContext::PushScope(ctx,pFVar15);
      pFVar15->functionScope = ctx->scope;
      local_4f8.source = (SynBase *)0x0;
      local_4f8.function = (FunctionData *)0x0;
      arguments_03.count = local_348.count;
      arguments_03.data = (ArgumentData *)local_348.data;
      arguments_03._12_4_ = 0;
      CreateFunctionArgumentVariables
                (ctx,source,pFVar15,arguments_03,(IntrusiveList<ExprVariableDefinition> *)&local_4f8
                );
      pSVar18 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
      pEVar19 = CreateFunctionContextArgument(ctx,pSVar18,pFVar15);
      pFVar15->argumentsSize = pFVar15->functionScope->dataSize;
      local_4d8.head = (ExprBase *)0x0;
      local_4d8.tail = (ExprBase *)0x0;
      pMVar27 = (type->aliases).tail;
      if (pMVar27 != (MatchData *)0x0) {
        do {
          pEVar13 = CreateVariableAccess
                              (ctx,source,*(VariableData **)&(local_4f8.source)->next->typeID,false)
          ;
          pEVar13 = CreateMemberAccess(ctx,source,pEVar13,
                                       *(SynIdentifier **)&pMVar27->type->typeIndex,false);
          pEVar20 = CreateVariableAccess
                              (ctx,source,
                               (VariableData *)
                               ((ExprBase *)((local_4f8.source)->pos).begin)[1]._vptr_ExprBase[1],
                               false);
          pEVar20 = CreateMemberAccess(ctx,source,pEVar20,
                                       *(SynIdentifier **)&pMVar27->type->typeIndex,false);
          pEVar13 = CreateAssignment(ctx,source,pEVar13,pEVar20);
          IntrusiveList<ExprBase>::push_back(&local_4d8,pEVar13);
          pMVar27 = *(MatchData **)&pMVar27->listed;
        } while (pMVar27 != (MatchData *)0x0);
      }
      iVar11 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
      pEVar13 = (ExprBase *)CONCAT44(extraout_var_05,iVar11);
      pTVar1 = ctx->typeVoid;
      iVar11 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
      pp_Var21 = (_func_int **)CONCAT44(extraout_var_06,iVar11);
      pTVar4 = ctx->typeVoid;
      *(undefined4 *)(pp_Var21 + 1) = 2;
      pp_Var21[2] = (_func_int *)source;
      pp_Var21[3] = (_func_int *)pTVar4;
      pp_Var21[4] = (_func_int *)0x0;
      *(undefined1 *)(pp_Var21 + 5) = 0;
      *pp_Var21 = (_func_int *)&PTR__ExprBase_003f6b40;
      pEVar13->typeID = 0x1c;
      pEVar13->source = source;
      pEVar13->type = pTVar1;
      pEVar13->next = (ExprBase *)0x0;
      pEVar13->listed = false;
      pEVar13->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003f6670;
      pEVar13[1]._vptr_ExprBase = pp_Var21;
      *(undefined8 *)&pEVar13[1].typeID = 0;
      pEVar13[1].source = (SynBase *)0x0;
      IntrusiveList<ExprBase>::push_back(&local_4d8,pEVar13);
      ClosePendingUpvalues(ctx,pFVar15);
      ExpressionContext::PopScope(ctx,SCOPE_FUNCTION,true);
      iVar11 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x78);
      pEVar13 = (ExprBase *)CONCAT44(extraout_var_07,iVar11);
      pTVar17 = pFVar15->type;
      local_4b8 = (undefined1  [8])local_4f8.source;
      uStack_4b0 = local_4f8.function;
      local_3e8 = (undefined1  [8])local_4d8.head;
      pEStack_3e0 = local_4d8.tail;
      pEVar13->typeID = 0x24;
      pEVar13->source = source;
      pEVar13->type = &pTVar17->super_TypeBase;
      pEVar13->next = (ExprBase *)0x0;
      pEVar13->listed = false;
      pEVar13->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003f66a8;
      pEVar13[1]._vptr_ExprBase = (_func_int **)pFVar15;
      *(ExprVariableDefinition **)&pEVar13[1].typeID = pEVar19;
      pEVar13[1].source = local_4f8.source;
      pEVar13[1].type = (TypeBase *)local_4f8.function;
      pEVar13[1].next = (ExprBase *)0x0;
      *(ExprBase **)&pEVar13[1].listed = local_4d8.head;
      pEVar13[2]._vptr_ExprBase = (_func_int **)local_4d8.tail;
      *(undefined8 *)&pEVar13[2].typeID = 0;
      pEVar13[2].source = (SynBase *)0x0;
      pFVar15->declaration = pEVar13;
      uVar24 = (ctx->definitions).count;
      if (uVar24 == (ctx->definitions).max) {
        SmallArray<ExprBase_*,_128U>::grow(&ctx->definitions,uVar24);
      }
      ppEVar5 = (ctx->definitions).data;
      if (ppEVar5 != (ExprBase **)0x0) {
        pEVar13 = pFVar15->declaration;
        uVar24 = (ctx->definitions).count;
        (ctx->definitions).count = uVar24 + 1;
        ppEVar5[uVar24] = pEVar13;
        IntrusiveList<ExprBase>::push_back(&classDefinition->functions,pFVar15->declaration);
        SmallArray<ArgumentData,_2U>::~SmallArray((SmallArray<ArgumentData,_2U> *)&local_348);
        goto LAB_00202430;
      }
      pcVar23 = "void SmallArray<ExprBase *, 128>::push_back(const T &) [T = ExprBase *, N = 128]";
      goto LAB_00202482;
    }
  }
LAB_00202456:
  pcVar23 = "void SmallArray<ArgumentData, 2>::push_back(const T &) [T = ArgumentData, N = 2]";
LAB_00202482:
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x162,pcVar23);
}

Assistant:

void CreateDefaultClassAssignment(ExpressionContext &ctx, SynBase *source, ExprClassDefinition *classDefinition)
{
	ctx.PopScope(SCOPE_TYPE);

	TypeClass *classType = classDefinition->classType;

	IntrusiveList<VariableHandle> customAssignMembers;

	for(MemberHandle *curr = classType->members.head; curr; curr = curr->next)
	{
		TypeBase *type = curr->variable->type;

		if(isType<TypeRef>(type) || isType<TypeArray>(type) || isType<TypeUnsizedArray>(type) || isType<TypeFunction>(type) || isType<TypeError>(type))
			continue;

		SmallArray<ArgumentData, 2> arguments(ctx.allocator);

		arguments.push_back(ArgumentData(source, false, NULL, ctx.GetReferenceType(type), NULL));
		arguments.push_back(ArgumentData(source, false, NULL, type, NULL));

		if(ExprBase *overloads = CreateVariableAccess(ctx, source, IntrusiveList<SynIdentifier>(), InplaceStr("="), false))
		{
			SmallArray<FunctionValue, 32> functions(ctx.allocator);

			GetNodeFunctions(ctx, source, overloads, functions);

			if(!functions.empty())
			{
				SmallArray<unsigned, 32> ratings(ctx.allocator);

				FunctionValue bestOverload = SelectBestFunction(ctx, source, functions, IntrusiveList<TypeHandle>(), arguments, ratings);

				if(bestOverload)
				{
					customAssignMembers.push_back(new (ctx.get<VariableHandle>()) VariableHandle(curr->source, curr->variable));
					continue;
				}
			}
		}

		if(ExprBase *overloads = CreateVariableAccess(ctx, source, IntrusiveList<SynIdentifier>(), InplaceStr("default_assign$_"), false))
		{
			SmallArray<FunctionValue, 32> functions(ctx.allocator);

			GetNodeFunctions(ctx, source, overloads, functions);

			if(!functions.empty())
			{
				SmallArray<unsigned, 32> ratings(ctx.allocator);

				FunctionValue bestOverload = SelectBestFunction(ctx, source, functions, IntrusiveList<TypeHandle>(), arguments, ratings);

				if(bestOverload)
				{
					customAssignMembers.push_back(new (ctx.get<VariableHandle>()) VariableHandle(curr->source, curr->variable));
					continue;
				}
			}
		}
	}

	if(!customAssignMembers.empty())
	{
		InplaceStr functionName = InplaceStr("default_assign$_");

		SmallArray<ArgumentData, 2> arguments(ctx.allocator);

		arguments.push_back(ArgumentData(source, false, new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("$left")), ctx.GetReferenceType(classType), NULL));
		arguments.push_back(ArgumentData(source, false, new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("$right")), classType, NULL));

		SynIdentifier *functionNameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(functionName);

		FunctionData *function = new (ctx.get<FunctionData>()) FunctionData(ctx.allocator, source, ctx.scope, false, false, false, ctx.GetFunctionType(source, ctx.typeVoid, arguments), ctx.GetReferenceType(ctx.typeVoid), functionNameIdentifier, IntrusiveList<MatchData>(), ctx.uniqueFunctionId++);

		classType->defaultAssign = function;

		// Fill in argument data
		for(unsigned i = 0; i < arguments.size(); i++)
			function->arguments.push_back(arguments[i]);

		CheckFunctionConflict(ctx, source, function->name->name);

		ctx.AddFunction(function);

		ctx.PushScope(function);

		function->functionScope = ctx.scope;

		IntrusiveList<ExprVariableDefinition> variables;

		CreateFunctionArgumentVariables(ctx, source, function, arguments, variables);

		ExprVariableDefinition *contextArgumentDefinition = CreateFunctionContextArgument(ctx, ctx.MakeInternal(source), function);

		function->argumentsSize = function->functionScope->dataSize;

		IntrusiveList<ExprBase> expressions;

		for(MemberHandle *curr = classType->members.head; curr; curr = curr->next)
		{
			VariableData *leftArgument = variables.head->variable->variable;

			ExprBase *left = CreateVariableAccess(ctx, source, leftArgument, false);

			ExprBase *leftMember = CreateMemberAccess(ctx, source, left, curr->variable->name, false);

			VariableData *rightArgument = getType<ExprVariableDefinition>(variables.head->next)->variable->variable;

			ExprBase *right = CreateVariableAccess(ctx, source, rightArgument, false);

			ExprBase *rightMember = CreateMemberAccess(ctx, source, right, curr->variable->name, false);

			expressions.push_back(CreateAssignment(ctx, source, leftMember, rightMember));
		}

		expressions.push_back(new (ctx.get<ExprReturn>()) ExprReturn(source, ctx.typeVoid, new (ctx.get<ExprVoid>()) ExprVoid(source, ctx.typeVoid), NULL, NULL));

		ClosePendingUpvalues(ctx, function);

		ctx.PopScope(SCOPE_FUNCTION);

		function->declaration = new (ctx.get<ExprFunctionDefinition>()) ExprFunctionDefinition(source, function->type, function, contextArgumentDefinition, variables, NULL, expressions, NULL, NULL);

		ctx.definitions.push_back(function->declaration);

		classDefinition->functions.push_back(function->declaration);
	}

	RestoreParentTypeScope(ctx, source, classDefinition->classType);
}